

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O0

int __thiscall calibrate_button(VCONTROLLER *this,int i)

{
  _Bool _Var1;
  int in_ESI;
  long in_RDI;
  int c;
  int local_18;
  
  _Var1 = key_down(0x3b);
  if (!_Var1) {
    for (local_18 = 1; local_18 < 0xe3; local_18 = local_18 + 1) {
      _Var1 = key_pressed(local_18);
      if (_Var1) {
        *(int *)(*(long *)(in_RDI + 0x20) + (long)in_ESI * 4) = local_18;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int calibrate_button(VCONTROLLER * this, int i)
{
   int c;

   if (key_down(ALLEGRO_KEY_ESCAPE)) {
      return 0;
   }

   for (c = 1; c < ALLEGRO_KEY_MAX; c++) {
      if (key_pressed(c)) {
         ((int *)(this->private_data))[i] = c;
         return 1;
      }
   }

   return 0;
}